

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::RequiredError::~RequiredError(RequiredError *this)

{
  void *in_RDI;
  
  ~RequiredError((RequiredError *)0x176608);
  operator_delete(in_RDI);
  return;
}

Assistant:

static RequiredError Subcommand(std::size_t min_subcom) {
        if(min_subcom == 1) {
            return RequiredError("A subcommand");
        }
        return {"Requires at least " + std::to_string(min_subcom) + " subcommands", ExitCodes::RequiredError};
    }